

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O1

void Omega_h::print_histogram(Histogram *histogram,string *name)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  uint uVar4;
  ios saved_state;
  char local_149;
  double local_148;
  double local_140;
  ios local_138 [264];
  
  std::ios::ios(local_138,(streambuf *)0x0);
  std::ios::copyfmt((ios *)local_138);
  lVar1 = std::cout;
  *(uint *)(std::__cxx11::string::compare + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::compare + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 2;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," histogram:\n",0xc);
  uVar4 = (uint)((ulong)((long)(histogram->bins).super__Vector_base<long,_std::allocator<long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(histogram->bins).super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar4) {
    local_148 = (histogram->max - histogram->min) / (double)(int)uVar4;
    uVar3 = 0;
    do {
      local_140 = histogram->min;
      poVar2 = std::ostream::_M_insert<double>((double)(int)uVar3 * local_148 + local_140);
      local_149 = '-';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_149,1);
      uVar3 = uVar3 + 1;
      poVar2 = std::ostream::_M_insert<double>((double)(int)uVar3 * local_148 + local_140);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      local_149 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_149,1);
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  std::ios::copyfmt((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  std::ios_base::~ios_base((ios_base *)local_138);
  return;
}

Assistant:

void print_histogram(Histogram const& histogram, std::string const& name) {
  std::ios saved_state(nullptr);
  saved_state.copyfmt(std::cout);
  std::cout << std::fixed << std::setprecision(2);
  std::cout << name << " histogram:\n";
  auto nbins = Int(histogram.bins.size());
  auto interval = (histogram.max - histogram.min) / Real(nbins);
  for (Int i = 0; i < nbins; ++i) {
    auto floor = interval * i + histogram.min;
    auto ceil = interval * (i + 1) + histogram.min;
    std::cout << floor << '-' << ceil << ": " << histogram.bins[std::size_t(i)]
              << '\n';
  }
  std::cout.copyfmt(saved_state);
}